

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_intersection_cardinality(run_container_t *src_1,run_container_t *src_2)

{
  int iVar1;
  rle16_t *prVar2;
  rle16_t *prVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  _Var4 = run_container_is_full(src_1);
  _Var5 = run_container_is_full(src_2);
  if (!_Var5 && !_Var4) {
    prVar2 = src_1->runs;
    uVar8 = (uint)prVar2->value;
    prVar3 = src_2->runs;
    uVar9 = (uint)prVar3->value;
    iVar6 = src_1->n_runs;
    iVar7 = 0;
    iVar10 = 0;
    iVar11 = 0;
    uVar12 = (uint)prVar2->value + (uint)prVar2->length + 1;
    uVar13 = (uint)prVar3->value + (uint)prVar3->length + 1;
    while ((iVar10 < iVar6 && (iVar1 = src_2->n_runs, iVar11 < iVar1))) {
      if (uVar9 < uVar12) {
        if (uVar8 < uVar13) {
          uVar14 = uVar9;
          if (uVar9 < uVar8) {
            uVar14 = uVar8;
          }
          uVar15 = uVar12;
          if (uVar12 == uVar13) {
            iVar10 = iVar10 + 1;
            if (iVar10 < iVar6) {
              uVar8 = (uint)prVar2[iVar10].value;
              uVar15 = prVar2[iVar10].length + uVar8 + 1;
            }
            iVar11 = iVar11 + 1;
            uVar13 = uVar12;
            if (iVar11 < iVar1) {
              uVar9 = (uint)prVar3[iVar11].value;
              uVar13 = prVar3[iVar11].length + uVar9 + 1;
            }
          }
          else if (uVar12 < uVar13) {
            iVar10 = iVar10 + 1;
            if (iVar10 < iVar6) {
              uVar8 = (uint)prVar2[iVar10].value;
              uVar15 = prVar2[iVar10].length + uVar8 + 1;
            }
          }
          else {
            iVar11 = iVar11 + 1;
            uVar12 = uVar13;
            if (iVar11 < iVar1) {
              uVar9 = (uint)prVar3[iVar11].value;
              uVar13 = uVar9 + prVar3[iVar11].length + 1;
            }
          }
          iVar7 = (iVar7 - uVar14) + uVar12;
          uVar12 = uVar15;
        }
        else {
          iVar11 = iVar11 + 1;
          if (iVar11 < iVar1) {
            uVar9 = (uint)prVar3[iVar11].value;
            uVar13 = uVar9 + prVar3[iVar11].length + 1;
          }
        }
      }
      else {
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar6) {
          uVar8 = (uint)prVar2[iVar10].value;
          uVar12 = prVar2[iVar10].length + uVar8 + 1;
        }
      }
    }
    return iVar7;
  }
  if (_Var4) {
    src_1 = src_2;
  }
  iVar6 = run_container_cardinality(src_1);
  return iVar6;
}

Assistant:

int run_container_intersection_cardinality(const run_container_t *src_1,
                                           const run_container_t *src_2) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return run_container_cardinality(src_2);
        }
        if (if2) {
            return run_container_cardinality(src_1);
        }
    }
    int answer = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            answer += earliestend - lateststart;
        }
    }
    return answer;
}